

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::DisjunctionPass0
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,int depth)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  EncodedChar *pEVar4;
  EncodedChar EVar5;
  
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  do {
    pEVar4 = this->next;
    if (this->inputLim < pEVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar2) goto LAB_00ec3239;
      *puVar3 = 0;
      pEVar4 = this->next;
    }
    EVar5 = *pEVar4;
    if (EVar5 == '\0') {
      if (this->inputLim <= pEVar4) break;
    }
    else if ((EVar5 == ')') || (EVar5 == '|')) break;
    TermPass0(this,depth);
  } while( true );
LAB_00ec31db:
  if (this->inputLim < pEVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar2) {
LAB_00ec3239:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pEVar4 = this->next;
    EVar5 = *pEVar4;
  }
  if (EVar5 != '|') {
    return;
  }
  if (this->inputLim < pEVar4 + 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar2) goto LAB_00ec3239;
    *puVar3 = 0;
    pEVar4 = this->next;
    if ((char)*pEVar4 < '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd6,"(!this->IsMultiUnitChar(next[i]))","!this->IsMultiUnitChar(next[i])"
                        );
      if (!bVar2) goto LAB_00ec3239;
      *puVar3 = 0;
      pEVar4 = this->next;
    }
  }
  pEVar4 = pEVar4 + 1;
  this->next = pEVar4;
  do {
    if (this->inputLim < pEVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar2) goto LAB_00ec3239;
      *puVar3 = 0;
      pEVar4 = this->next;
    }
    EVar5 = *pEVar4;
    if (EVar5 == '\0') {
      if (this->inputLim <= pEVar4) goto LAB_00ec31db;
    }
    else if ((EVar5 == ')') || (EVar5 == '|')) goto LAB_00ec31db;
    TermPass0(this,depth);
    pEVar4 = this->next;
  } while( true );
}

Assistant:

void Parser<P, IsLiteral>::DisjunctionPass0(int depth)
    {
        AlternativePass0(depth);
        while (true)
        {
            // Could be terminating 0
            if (ECLookahead() != '|')
                return;
            ECConsume();
            AlternativePass0(depth);
        }
    }